

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_socket.cpp
# Opt level: O2

void __thiscall
libtorrent::aux::udp_socket::wrap
          (udp_socket *this,char *hostname,int port,span<const_char> p,error_code *ec,
          udp_send_flags_t flags)

{
  char *pcVar1;
  element_type *peVar2;
  undefined8 uVar3;
  size_t sVar4;
  size_t __n;
  bool df_00;
  set_dont_frag df;
  char *h;
  array<char,_255UL> header;
  set_dont_frag local_190;
  array<boost::asio::const_buffer,_2UL> local_180;
  char *local_160;
  data_union local_158;
  char local_12f [255];
  
  local_160 = local_12f;
  df_00 = false;
  write_impl<unsigned_short,int,char*>(0,&local_160);
  *local_160 = '\0';
  pcVar1 = local_160 + 1;
  local_160 = local_160 + 1;
  *pcVar1 = '\x03';
  pcVar1 = local_160;
  local_160 = local_160 + 1;
  sVar4 = strlen(hostname);
  __n = 0xf8;
  if (sVar4 < 0xf8) {
    __n = sVar4;
  }
  pcVar1[1] = (char)__n;
  local_160 = local_160 + 1;
  memcpy(local_160,hostname,__n);
  local_160 = local_160 + __n;
  write_impl<unsigned_short,int,char*>(port,&local_160);
  local_180._M_elems[0].data_ = local_12f;
  local_180._M_elems[0].size_ = (long)local_160 - (long)local_180._M_elems[0].data_;
  local_180._M_elems[1].data_ = p.m_ptr;
  local_180._M_elems[1].size_ = p.m_len;
  if ((flags.m_val & 8) != 0) {
    boost::asio::
    basic_socket<boost::asio::ip::udp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
    ::local_endpoint((endpoint_type *)&local_158.base,
                     (basic_socket<boost::asio::ip::udp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                      *)this,ec);
    df_00 = local_158.base.sa_family == 2;
  }
  set_dont_frag::set_dont_frag(&local_190,&this->m_socket,df_00);
  peVar2 = (this->m_socks5_connection).
           super___shared_ptr<libtorrent::aux::socks5,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_158._0_8_ = *(undefined8 *)&(peVar2->m_udp_proxy_addr).impl_.data_;
  uVar3 = *(undefined8 *)((long)&(peVar2->m_udp_proxy_addr).impl_.data_ + 8);
  local_158._20_8_ = *(undefined8 *)((long)&(peVar2->m_udp_proxy_addr).impl_.data_ + 0x14);
  local_158._16_4_ =
       (undefined4)
       ((ulong)*(undefined8 *)((long)&(peVar2->m_udp_proxy_addr).impl_.data_ + 0xc) >> 0x20);
  local_158._8_4_ = (undefined4)uVar3;
  local_158._12_4_ = (undefined4)((ulong)uVar3 >> 0x20);
  boost::asio::
  basic_datagram_socket<boost::asio::ip::udp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>
  ::send_to<std::array<boost::asio::const_buffer,2ul>>
            ((basic_datagram_socket<boost::asio::ip::udp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>
              *)this,&local_180,(endpoint_type *)&local_158.base,0,ec);
  set_dont_frag::~set_dont_frag(&local_190);
  return;
}

Assistant:

void udp_socket::wrap(char const* hostname, int const port, span<char const> p
	, error_code& ec, udp_send_flags_t const flags)
{
	using namespace libtorrent::aux;

	std::array<char, max_header_size> header;
	char* h = header.data();

	write_uint16(0, h); // reserved
	write_uint8(0, h); // fragment
	write_uint8(3, h); // atyp
	std::size_t const hostlen = std::min(std::strlen(hostname), max_header_size - 7);
	write_uint8(hostlen, h); // hostname len
	std::memcpy(h, hostname, hostlen);
	h += hostlen;
	write_uint16(port, h);

	std::array<boost::asio::const_buffer, 2> iovec;
	iovec[0] = boost::asio::const_buffer(header.data(), aux::numeric_cast<std::size_t>(h - header.data()));
	iovec[1] = boost::asio::const_buffer(p.data(), static_cast<std::size_t>(p.size()));

	// set the DF flag for the socket and clear it again in the destructor
	set_dont_frag df(m_socket, (flags & dont_fragment)
		&& aux::is_v4(m_socket.local_endpoint(ec)));

	m_socket.send_to(iovec, m_socks5_connection->target(), 0, ec);
}